

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O3

void jpeg_fdct_4x2(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  JSAMPROW pJVar3;
  bool bVar4;
  ulong uVar5;
  bool bVar6;
  DCTELEM *pDVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  undefined1 auVar13 [16];
  long lVar14;
  long lVar15;
  undefined1 auVar16 [16];
  
  lVar8 = 0;
  memset(data,0,0x100);
  uVar5 = (ulong)start_col;
  pDVar7 = data;
  bVar4 = true;
  do {
    bVar6 = bVar4;
    pJVar3 = sample_data[lVar8];
    iVar11 = (uint)pJVar3[uVar5] + (uint)pJVar3[uVar5 + 3];
    iVar12 = (uint)pJVar3[uVar5 + 1] + (uint)pJVar3[uVar5 + 2];
    lVar9 = (ulong)pJVar3[uVar5] - (ulong)pJVar3[uVar5 + 3];
    lVar8 = (ulong)pJVar3[uVar5 + 1] - (ulong)pJVar3[uVar5 + 2];
    *pDVar7 = (iVar12 + iVar11) * 0x20 + -0x4000;
    pDVar7[2] = (iVar11 - iVar12) * 0x20;
    lVar10 = (lVar8 + lVar9) * 0x1151;
    pDVar7[1] = (DCTELEM)((ulong)(lVar9 * 0x187e + lVar10 + 0x80) >> 8);
    pDVar7[3] = (DCTELEM)((ulong)(lVar8 * 0xffffffc4df + lVar10 + 0x80) >> 8);
    pDVar7 = pDVar7 + 8;
    lVar8 = 1;
    bVar4 = false;
  } while (bVar6);
  auVar1 = *(undefined1 (*) [16])data;
  auVar2 = *(undefined1 (*) [16])(data + 8);
  auVar13._0_8_ = auVar1._0_8_;
  auVar13._8_4_ = auVar1._4_4_;
  auVar13._12_4_ = -(uint)(auVar1._4_4_ < 0);
  lVar10 = CONCAT44(-(uint)(auVar1._0_4_ < 0),auVar1._0_4_) + 2;
  lVar14 = auVar13._8_8_ + 2;
  lVar8 = CONCAT44(-(uint)(auVar1._8_4_ < 0),auVar1._8_4_) + 2;
  lVar9 = CONCAT44(-(uint)(auVar1._12_4_ < 0),auVar1._12_4_) + 2;
  iVar11 = auVar2._8_4_;
  iVar12 = auVar2._12_4_;
  auVar16._0_8_ = auVar2._0_8_;
  auVar16._8_4_ = auVar2._4_4_;
  auVar16._12_4_ = -(uint)(auVar2._4_4_ < 0);
  lVar15 = CONCAT44(-(uint)(auVar2._0_4_ < 0),auVar2._0_4_);
  auVar1._8_4_ = (int)lVar9;
  auVar1._0_8_ = lVar8;
  auVar1._12_4_ = (int)((ulong)lVar9 >> 0x20);
  *data = (DCTELEM)((ulong)(lVar10 + lVar15) >> 2);
  data[1] = (DCTELEM)((ulong)(lVar14 + auVar16._8_8_) >> 2);
  data[2] = (DCTELEM)((ulong)(lVar8 + CONCAT44(-(uint)(iVar11 < 0),iVar11)) >> 2);
  data[3] = (DCTELEM)((ulong)(auVar1._8_8_ + CONCAT44(-(uint)(iVar12 < 0),iVar12)) >> 2);
  data[8] = (DCTELEM)((ulong)(lVar10 - lVar15) >> 2);
  data[9] = (DCTELEM)((ulong)(lVar14 - auVar16._8_8_) >> 2);
  data[10] = (DCTELEM)((ulong)(lVar8 - CONCAT44(-(uint)(iVar11 < 0),iVar11)) >> 2);
  data[0xb] = (DCTELEM)((ulong)(lVar9 - CONCAT44(-(uint)(iVar12 < 0),iVar12)) >> 2);
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_4x2 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1;
  INT32 tmp10, tmp11;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pre-zero output coefficient block. */
  MEMZERO(data, SIZEOF(DCTELEM) * DCTSIZE2);

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */
  /* We must also scale the output by (8/4)*(8/2) = 2**3, which we add here. */
  /* 4-point FDCT kernel, */
  /* cK represents sqrt(2) * cos(K*pi/16) [refers to 8-point FDCT]. */

  dataptr = data;
  for (ctr = 0; ctr < 2; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[3]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[2]);

    tmp10 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[3]);
    tmp11 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[2]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((tmp0 + tmp1 - 4 * CENTERJSAMPLE) << (PASS1_BITS+3));
    dataptr[2] = (DCTELEM) ((tmp0 - tmp1) << (PASS1_BITS+3));

    /* Odd part */

    tmp0 = MULTIPLY(tmp10 + tmp11, FIX_0_541196100);       /* c6 */
    /* Add fudge factor here for final descale. */
    tmp0 += ONE << (CONST_BITS-PASS1_BITS-4);

    dataptr[1] = (DCTELEM)
      RIGHT_SHIFT(tmp0 + MULTIPLY(tmp10, FIX_0_765366865), /* c2-c6 */
		  CONST_BITS-PASS1_BITS-3);
    dataptr[3] = (DCTELEM)
      RIGHT_SHIFT(tmp0 - MULTIPLY(tmp11, FIX_1_847759065), /* c2+c6 */
		  CONST_BITS-PASS1_BITS-3);

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   */

  dataptr = data;
  for (ctr = 0; ctr < 4; ctr++) {
    /* Even part */

    /* Add fudge factor here for final descale. */
    tmp0 = dataptr[DCTSIZE*0] + (ONE << (PASS1_BITS-1));
    tmp1 = dataptr[DCTSIZE*1];

    dataptr[DCTSIZE*0] = (DCTELEM) RIGHT_SHIFT(tmp0 + tmp1, PASS1_BITS);

    /* Odd part */

    dataptr[DCTSIZE*1] = (DCTELEM) RIGHT_SHIFT(tmp0 - tmp1, PASS1_BITS);

    dataptr++;			/* advance pointer to next column */
  }
}